

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void __thiscall duckdb::Vector::Vector(Vector *this,Vector *other,idx_t offset,idx_t end)

{
  LogicalType::LogicalType(&this->type,&other->type);
  (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
  (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->validity).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Slice(this,other,offset,end);
  return;
}

Assistant:

Vector::Vector(const Vector &other, idx_t offset, idx_t end) : type(other.type) {
	Slice(other, offset, end);
}